

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::
Table<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry,_kj::HashIndex<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Callbacks>_>
::Impl<0UL,_false>::insert
          (Impl<0UL,_false> *this,
          Table<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry,_kj::HashIndex<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Callbacks>_>
          *table,size_t pos,Entry *row,uint skip)

{
  Entry *pEVar1;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  Maybe<unsigned_long> MVar2;
  ArrayPtr<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry> table_00;
  bool local_61;
  size_t pos_local;
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp____kj_table_h:478:5)>
  local_58;
  
  if (skip == 0) {
    *this = (Impl<0UL,_false>)0x0;
  }
  else {
    pEVar1 = (table->rows).builder.ptr;
    table_00.size_ = (size_t)pEVar1;
    table_00.ptr = (Entry *)&table->indexes;
    pos_local = pos;
    MVar2 = HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks>::
            insert<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Entry,kj::StringPtr&>
                      ((HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks>
                        *)&local_58,table_00,((long)(table->rows).builder.pos - (long)pEVar1) / 0x50
                       ,(StringPtr *)pos);
    pos = (size_t)MVar2.ptr.field_1;
    if ((char)local_58.func.success == '\x01') {
      *this = (Impl<0UL,_false>)0x1;
      *(HashIndex<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>
        **)(this + 8) = local_58.func.indexObj;
    }
    else {
      local_58.func.success = &local_61;
      local_58.func.pos = &pos_local;
      local_58.canceled = false;
      *this = (Impl<0UL,_false>)0x0;
      local_61 = true;
      local_58.func.indexObj =
           (HashIndex<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>
            *)&table->indexes;
      local_58.func.table =
           (Table<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry,_kj::HashIndex<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>_>
            *)table;
      local_58.func.row = (Entry *)row;
      kj::_::
      Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/../kj/table.h:478:5)>
      ::~Deferred(&local_58);
      pos = (size_t)extraout_RDX;
    }
  }
  MVar2.ptr.field_1.value = pos;
  MVar2.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar2.ptr;
}

Assistant:

static kj::Maybe<size_t> insert(Table<Row, Indexes...>& table, size_t pos, Row& row, uint skip) {
    if (skip == index) {
      return Impl<index + 1>::insert(table, pos, row, skip);
    }
    auto& indexObj = get<index>(table.indexes);
    KJ_IF_MAYBE(existing, indexObj.insert(table.rows.asPtr(), pos, indexObj.keyForRow(row))) {
      return *existing;
    }

    bool success = false;
    KJ_DEFER(if (!success) {
      indexObj.erase(table.rows.asPtr(), pos, indexObj.keyForRow(row));
    });
    auto result = Impl<index + 1>::insert(table, pos, row, skip);
    success = result == nullptr;
    return result;
  }